

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAuxSourceDirectoryCommand.h
# Opt level: O0

cmCommand * __thiscall cmAuxSourceDirectoryCommand::Clone(cmAuxSourceDirectoryCommand *this)

{
  cmCommand *this_00;
  cmAuxSourceDirectoryCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmAuxSourceDirectoryCommand((cmAuxSourceDirectoryCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmAuxSourceDirectoryCommand; }